

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heuristic-base.hxx
# Opt level: O1

void __thiscall lineage::heuristics::HeuristicBase::logObj(HeuristicBase *this)

{
  Data *pDVar1;
  pointer pcVar2;
  long lVar3;
  ostream *poVar4;
  rep rVar5;
  double extraout_XMM0_Qa;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  stringstream stream;
  ofstream file;
  long *local_3b8;
  long local_3b0;
  long local_3a8 [2];
  stringstream local_398 [128];
  ios_base local_318 [264];
  long local_210;
  filebuf local_208 [240];
  ios_base local_118 [264];
  
  if (this->silent_ == false) {
    pDVar1 = this->data_;
    lVar3 = std::chrono::_V2::system_clock::now();
    (pDVar1->timer).m_seconds =
         (double)(lVar3 - (pDVar1->timer).m_timeObject.__d.__r) / 1000000000.0 +
         (pDVar1->timer).m_seconds;
    std::__cxx11::stringstream::stringstream(local_398);
    poVar4 = std::ostream::_M_insert<double>((this->data_->timer).m_seconds);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"inf ",4);
    lVar3 = *(long *)poVar4;
    *(undefined8 *)(poVar4 + *(long *)(lVar3 + -0x18) + 8) = 10;
    lVar3 = *(long *)(lVar3 + -0x18);
    *(uint *)(poVar4 + lVar3 + 0x18) = *(uint *)(poVar4 + lVar3 + 0x18) & 0xfffffefb | 4;
    (*this->_vptr_HeuristicBase[2])(this);
    poVar4 = std::ostream::_M_insert<double>(extraout_XMM0_Qa);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"nan",3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," 0 0 0",6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," 0 0 0",6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," 0 0\n",5);
    pcVar2 = (this->data_->solutionName)._M_dataplus._M_p;
    local_3b8 = local_3a8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_3b8,pcVar2,pcVar2 + (this->data_->solutionName)._M_string_length);
    std::__cxx11::string::append((char *)&local_3b8);
    std::ofstream::ofstream(&local_210,(string *)&local_3b8,_S_out|_S_app);
    if (local_3b8 != local_3a8) {
      operator_delete(local_3b8,local_3a8[0] + 1);
    }
    std::__cxx11::stringbuf::str();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_210,(char *)local_3b8,local_3b0);
    if (local_3b8 != local_3a8) {
      operator_delete(local_3b8,local_3a8[0] + 1);
    }
    std::ofstream::close();
    local_210 = _VTT;
    *(undefined8 *)(local_208 + *(long *)(_VTT + -0x18) + -8) = _typeinfo;
    std::filebuf::~filebuf(local_208);
    std::ios_base::~ios_base(local_118);
    pDVar1 = this->data_;
    rVar5 = std::chrono::_V2::system_clock::now();
    (pDVar1->timer).m_timeObject.__d.__r = rVar5;
    std::__cxx11::stringstream::~stringstream(local_398);
    std::ios_base::~ios_base(local_318);
  }
  return;
}

Assistant:

inline void
HeuristicBase::logObj() const
{
    if (silent_)
        return;

    data_.timer.stop(); // dont time log-IO

    std::stringstream stream;
    stream << data_.timer.get_elapsed_seconds() << " "
           << "inf " // bound
           << std::setprecision(10) << std::fixed << getObjective()
           << " "      // objBest
           << "nan"    // gap
           << " 0 0 0" // violated constraints;
           << " 0 0 0" // termination/birth/bifuraction constr.
           << " 0 0\n";

    {
        std::ofstream file(data_.solutionName + "-optimization-log.txt",
                           std::ofstream::out | std::ofstream::app);
        file << stream.str();
        file.close();
    }

    data_.timer.start();
}